

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O3

void obj_move_timers(obj *src,obj *dest)

{
  int iVar1;
  timer_element *ptVar2;
  
  iVar1 = 0;
  for (ptVar2 = src->olev->lev_timers; ptVar2 != (timer_element *)0x0; ptVar2 = ptVar2->next) {
    if ((ptVar2->kind == 2) && ((obj *)ptVar2->arg == src)) {
      ptVar2->arg = dest;
      dest->timed = dest->timed + '\x01';
      iVar1 = iVar1 + 1;
    }
  }
  if (iVar1 != src->timed) {
    panic("obj_move_timers");
  }
  src->timed = '\0';
  return;
}

Assistant:

void obj_move_timers(struct obj *src, struct obj *dest)
{
    int count;
    timer_element *curr;

    for (count = 0, curr = src->olev->lev_timers; curr; curr = curr->next)
	if (curr->kind == TIMER_OBJECT && curr->arg == src) {
	    curr->arg = dest;
	    dest->timed++;
	    count++;
	}
    if (count != src->timed)
	panic("obj_move_timers");
    src->timed = 0;
}